

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dep_for_basicchild_stdfunc.cpp
# Opt level: O2

void h(int *i,int s)

{
  long lVar1;
  ostream *poVar2;
  
  success = f_finished;
  spin_mutex_t::lock(&my_io_mutex);
  std::operator<<((ostream *)&std::cerr,"h begin: ");
  lVar1 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar1 - (long)t0.__d.__r) / 1000000000.0);
  poVar2 = std::operator<<(poVar2," with i=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*i);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  poVar2 = std::operator<<((ostream *)&std::cout,"h received i=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*i);
  std::endl<char,std::char_traits<char>>(poVar2);
  *i = *i + s;
  spin_mutex_t::lock(&my_io_mutex);
  std::operator<<((ostream *)&std::cerr,"h finish: ");
  lVar1 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar1 - (long)t0.__d.__r) / 1000000000.0);
  poVar2 = std::operator<<(poVar2," with i=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*i);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  return;
}

Assistant:

void h(int &i, int s) 
{
  success = f_finished;
  LOG("h begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
  std::cout << "h received i=" << i << std::endl;
  i += s;  
  LOG("h finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
}